

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O1

ssize_t __thiscall
uWS::WebSocket<false>::send(WebSocket<false> *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint *puVar1;
  ulong uVar2;
  void *pvVar3;
  ushort uVar4;
  byte bVar5;
  code *pcVar6;
  Socket *pSVar7;
  uint uVar8;
  long *plVar9;
  ssize_t sVar10;
  ssize_t extraout_RAX;
  undefined8 *puVar11;
  undefined8 uVar12;
  uint *puVar13;
  undefined4 in_register_00000034;
  uv_poll_t *puVar14;
  undefined4 in_register_00000084;
  long in_R9;
  undefined1 uVar15;
  char *memory;
  long lVar16;
  long lVar17;
  bool wasTransferred_1;
  bool wasTransferred;
  char local_5a;
  char local_59;
  long local_58;
  code *local_50;
  void *local_48;
  Socket *local_40;
  long *local_38;
  
  local_48 = (void *)CONCAT44(in_register_00000034,__fd);
  bVar5 = (byte)__n;
  plVar9 = (long *)((this->super_Socket).p)->data;
  local_50 = (code *)CONCAT44(in_register_00000084,__flags);
  uVar15 = SUB81(__buf,0);
  uVar4 = (ushort)__buf;
  local_58 = in_R9;
  local_40 = &this->super_Socket;
  if (plVar9[4] != 0) {
    plVar9 = (long *)operator_new__((long)__buf + 0x3e);
    plVar9[1] = (long)__buf + 0xe;
    *plVar9 = (long)(plVar9 + 6);
    plVar9[2] = 0;
    if (__buf < (void *)0x7e) {
      *(undefined1 *)((long)plVar9 + 0x31) = uVar15;
      lVar16 = 2;
    }
    else if (__buf < (void *)0x10000) {
      *(undefined1 *)((long)plVar9 + 0x31) = 0x7e;
      *(ushort *)((long)plVar9 + 0x32) = uVar4 << 8 | uVar4 >> 8;
      lVar16 = 4;
    }
    else {
      *(undefined1 *)((long)plVar9 + 0x31) = 0x7f;
      *(ulong *)((long)plVar9 + 0x32) =
           (ulong)__buf >> 0x38 | ((ulong)__buf & 0xff000000000000) >> 0x28 |
           ((ulong)__buf & 0xff0000000000) >> 0x18 | ((ulong)__buf & 0xff00000000) >> 8 |
           ((ulong)__buf & 0xff000000) << 8 | ((ulong)__buf & 0xff0000) << 0x18 |
           ((ulong)__buf & 0xff00) << 0x28 | (long)__buf << 0x38;
      lVar16 = 10;
    }
    *(byte *)(plVar9 + 6) = bVar5 | 0x80;
    *(byte *)((long)plVar9 + 0x31) = *(byte *)((long)plVar9 + 0x31) | 0x80;
    uVar8 = rand();
    *(uint *)((long)plVar9 + lVar16 + 0x30) = uVar8;
    puVar13 = (uint *)((long)(plVar9 + 6) + lVar16 + 4);
    memcpy(puVar13,local_48,(size_t)__buf);
    if (0 < (long)__buf) {
      puVar1 = (uint *)((long)__buf + (long)puVar13);
      do {
        *puVar13 = *puVar13 ^ uVar8;
        puVar13 = puVar13 + 1;
      } while (puVar13 < puVar1);
    }
    plVar9[1] = lVar16 + 4 + (long)__buf;
    plVar9[3] = (long)local_50;
    plVar9[4] = local_58;
    pvVar3 = ((Socket *)&local_40->p)->p->data;
    plVar9[2] = 0;
    puVar11 = (undefined8 *)(*(long *)((long)pvVar3 + 0x28) + 0x10);
    if (*(long *)((long)pvVar3 + 0x28) == 0) {
      puVar11 = (undefined8 *)((long)pvVar3 + 0x20);
    }
    *puVar11 = plVar9;
    *(long **)((long)pvVar3 + 0x28) = plVar9;
    return (ssize_t)pvVar3;
  }
  uVar2 = (long)__buf + 0x3e;
  if (uVar2 < 0x401) {
    lVar17 = ((uVar2 >> 4) + 1) - (ulong)((uVar2 & 0xf) == 0);
    lVar16 = *(long *)(*plVar9 + 0x28);
    plVar9 = *(long **)(lVar16 + lVar17 * 8);
    if (plVar9 == (long *)0x0) {
      plVar9 = (long *)operator_new__(lVar17 * 0x10);
    }
    else {
      *(undefined8 *)(lVar16 + lVar17 * 8) = 0;
    }
    local_38 = plVar9 + 6;
    *plVar9 = (long)local_38;
    if (__buf < (void *)0x7e) {
      *(undefined1 *)((long)plVar9 + 0x31) = uVar15;
      lVar16 = 2;
    }
    else if (__buf < (void *)0x10000) {
      *(undefined1 *)((long)plVar9 + 0x31) = 0x7e;
      *(ushort *)((long)plVar9 + 0x32) = uVar4 << 8 | uVar4 >> 8;
      lVar16 = 4;
    }
    else {
      *(undefined1 *)((long)plVar9 + 0x31) = 0x7f;
      *(ulong *)((long)plVar9 + 0x32) =
           (ulong)__buf >> 0x38 | ((ulong)__buf & 0xff000000000000) >> 0x28 |
           ((ulong)__buf & 0xff0000000000) >> 0x18 | ((ulong)__buf & 0xff00000000) >> 8 |
           ((ulong)__buf & 0xff000000) << 8 | ((ulong)__buf & 0xff0000) << 0x18 |
           ((ulong)__buf & 0xff00) << 0x28 | (long)__buf << 0x38;
      lVar16 = 10;
    }
    *(byte *)(plVar9 + 6) = bVar5 | 0x80;
    *(byte *)((long)plVar9 + 0x31) = *(byte *)((long)plVar9 + 0x31) | 0x80;
    uVar8 = rand();
    *(uint *)((long)plVar9 + lVar16 + 0x30) = uVar8;
    puVar13 = (uint *)((long)local_38 + lVar16 + 4);
    memcpy(puVar13,local_48,(size_t)__buf);
    pSVar7 = local_40;
    if (0 < (long)__buf) {
      __n = (size_t)puVar13;
      do {
        *(uint *)__n = *(uint *)__n ^ uVar8;
        __n = __n + 4;
      } while (__n < (uint *)((long)__buf + (long)puVar13));
    }
    plVar9[1] = lVar16 + 4 + (long)__buf;
    sVar10 = uS::Socket::write(local_40,(int)plVar9,&local_59,__n);
    if ((char)sVar10 != '\0') {
      if (local_59 != '\0') {
        plVar9[3] = (long)local_50;
        goto LAB_00114e9b;
      }
      lVar16 = *(long *)(*pSVar7->p->data + 0x28);
      if (*(long *)(lVar16 + lVar17 * 8) == 0) {
        *(long **)(lVar16 + lVar17 * 8) = plVar9;
      }
      else {
        operator_delete__(plVar9);
      }
      if (local_50 == (code *)0x0) {
        return 0;
      }
      puVar14 = pSVar7->p;
      uVar12 = 0;
      goto LAB_00114ec4;
    }
    if (local_50 == (code *)0x0) {
      return 0;
    }
    puVar14 = pSVar7->p;
  }
  else {
    plVar9 = (long *)operator_new__(uVar2);
    plVar9[1] = (long)__buf + 0xe;
    *plVar9 = (long)(plVar9 + 6);
    plVar9[2] = 0;
    if (__buf < (void *)0x7e) {
      *(undefined1 *)((long)plVar9 + 0x31) = uVar15;
      lVar16 = 2;
    }
    else if (__buf < (void *)0x10000) {
      *(undefined1 *)((long)plVar9 + 0x31) = 0x7e;
      *(ushort *)((long)plVar9 + 0x32) = uVar4 << 8 | uVar4 >> 8;
      lVar16 = 4;
    }
    else {
      *(undefined1 *)((long)plVar9 + 0x31) = 0x7f;
      *(ulong *)((long)plVar9 + 0x32) =
           (ulong)__buf >> 0x38 | ((ulong)__buf & 0xff000000000000) >> 0x28 |
           ((ulong)__buf & 0xff0000000000) >> 0x18 | ((ulong)__buf & 0xff00000000) >> 8 |
           ((ulong)__buf & 0xff000000) << 8 | ((ulong)__buf & 0xff0000) << 0x18 |
           ((ulong)__buf & 0xff00) << 0x28 | (long)__buf << 0x38;
      lVar16 = 10;
    }
    *(byte *)(plVar9 + 6) = bVar5 | 0x80;
    *(byte *)((long)plVar9 + 0x31) = *(byte *)((long)plVar9 + 0x31) | 0x80;
    uVar8 = rand();
    *(uint *)((long)plVar9 + lVar16 + 0x30) = uVar8;
    puVar13 = (uint *)((long)(plVar9 + 6) + lVar16 + 4);
    memcpy(puVar13,local_48,(size_t)__buf);
    pSVar7 = local_40;
    if (0 < (long)__buf) {
      __n = (size_t)puVar13;
      do {
        *(uint *)__n = *(uint *)__n ^ uVar8;
        __n = __n + 4;
      } while (__n < (uint *)((long)__buf + (long)puVar13));
    }
    plVar9[1] = lVar16 + 4 + (long)__buf;
    sVar10 = uS::Socket::write(local_40,(int)plVar9,&local_5a,__n);
    pcVar6 = local_50;
    if ((char)sVar10 != '\0') {
      if (local_5a == '\0') {
        operator_delete__(plVar9);
        if (pcVar6 == (code *)0x0) {
          return extraout_RAX;
        }
        sVar10 = (*pcVar6)(pSVar7->p,local_58,0,0);
        return sVar10;
      }
      plVar9[3] = (long)local_50;
LAB_00114e9b:
      plVar9[4] = local_58;
      return local_58;
    }
    if (local_50 == (code *)0x0) {
      return 0;
    }
    puVar14 = pSVar7->p;
  }
  uVar12 = 1;
LAB_00114ec4:
  sVar10 = (*local_50)(puVar14,local_58,uVar12,0);
  return sVar10;
}

Assistant:

void WebSocket<isServer>::send(const char *message, size_t length, OpCode opCode, void(*callback)(void *webSocket, void *data, bool cancelled, void *reserved), void *callbackData) {
    const int HEADER_LENGTH = WebSocketProtocol<!isServer>::LONG_MESSAGE_HEADER;

    if (hasEmptyQueue()) {
        if (length + sizeof(uS::SocketData::Queue::Message) + HEADER_LENGTH <= uS::NodeData::preAllocMaxSize) {
            int memoryLength = length + sizeof(uS::SocketData::Queue::Message) + HEADER_LENGTH;
            int memoryIndex = getSocketData()->nodeData->getMemoryBlockIndex(memoryLength);

            uS::SocketData::Queue::Message *messagePtr = (uS::SocketData::Queue::Message *) getSocketData()->nodeData->getSmallMemoryBlock(memoryIndex);
            messagePtr->data = ((char *) messagePtr) + sizeof(uS::SocketData::Queue::Message);
            messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);

            bool wasTransferred;
            if (write(messagePtr, wasTransferred)) {
                if (!wasTransferred) {
                    getSocketData()->nodeData->freeSmallMemoryBlock((char *) messagePtr, memoryIndex);
                    if (callback) {
                        callback(*this, callbackData, false, nullptr);
                    }
                } else {
                    messagePtr->callback = callback;
                    messagePtr->callbackData = callbackData;
                }
            } else {
                if (callback) {
                    callback(*this, callbackData, true, nullptr);
                }
            }
        } else {
            uS::SocketData::Queue::Message *messagePtr = allocMessage(length + HEADER_LENGTH);
            messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);
            bool wasTransferred;
            if (write(messagePtr, wasTransferred)) {
                if (!wasTransferred) {
                    freeMessage(messagePtr);
                    if (callback) {
                        callback(*this, callbackData, false, nullptr);
                    }
                } else {
                    messagePtr->callback = callback;
                    messagePtr->callbackData = callbackData;
                }
            } else {
                if (callback) {
                    callback(*this, callbackData, true, nullptr);
                }
            }
        }
    } else {
        uS::SocketData::Queue::Message *messagePtr = allocMessage(length + HEADER_LENGTH);
        messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);
        messagePtr->callback = callback;
        messagePtr->callbackData = callbackData;
        enqueue(messagePtr);
    }
}